

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O1

int archive_read_format_raw_read_data_skip(archive_read *a)

{
  void *pvVar1;
  
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 8) != 0) {
    __archive_read_consume(a,*(long *)((long)pvVar1 + 8));
    *(undefined8 *)((long)pvVar1 + 8) = 0;
  }
  *(undefined4 *)((long)pvVar1 + 0x10) = 1;
  return 0;
}

Assistant:

static int
archive_read_format_raw_read_data_skip(struct archive_read *a)
{
	struct raw_info *info = (struct raw_info *)(a->format->data);

	/* Consume the bytes we read last time. */
	if (info->unconsumed) {
		__archive_read_consume(a, info->unconsumed);
		info->unconsumed = 0;
	}
	info->end_of_file = 1;
	return (ARCHIVE_OK);
}